

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_modifier(Parser *parser)

{
  bool bVar1;
  List *modifiers_00;
  Modifier *modifier;
  void *pvVar2;
  List *modifiers;
  Token *tok;
  Parser *parser_local;
  
  modifiers = (List *)parser->token;
  modifiers_00 = new_list();
  while( true ) {
    bVar1 = is_modifier((Token *)modifiers);
    if (bVar1 == 0) break;
    list_add(modifiers_00,modifiers);
    bmove(parser);
    modifiers = (List *)parser->token;
  }
  modifier = new_modifier(modifiers_00);
  pvVar2 = parse_id(parser,modifier);
  return pvVar2;
}

Assistant:

void *parse_modifier(Parser *parser) {
    Token *tok = token(parser);
    List *modifiers = new_list();
    while (is_modifier(tok)) {
        list_add(modifiers, tok);
        bmove(parser);
        tok = token(parser);
    }
    return parse_id(parser, new_modifier(modifiers));
}